

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBToUVRow_AVX2(uint8_t *src_argb0,int src_stride_argb,uint8_t *dst_u,uint8_t *dst_v,int width
                     )

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  int iVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int width_local;
  
  auVar9._16_16_ = (undefined1  [16])libyuv::kAddUV128;
  auVar9._0_16_ = (undefined1  [16])libyuv::kAddUV128;
  auVar10._16_16_ = (undefined1  [16])libyuv::kARGBToV;
  auVar10._0_16_ = (undefined1  [16])libyuv::kARGBToV;
  auVar11._16_16_ = (undefined1  [16])libyuv::kARGBToU;
  auVar11._0_16_ = (undefined1  [16])libyuv::kARGBToU;
  lVar5 = (long)dst_v - (long)dst_u;
  do {
    auVar2 = vpavgb_avx2(*(undefined1 (*) [32])src_argb0,
                         *(undefined1 (*) [32])(*(undefined1 (*) [32])src_argb0 + src_stride_argb));
    auVar8 = vpavgb_avx2(*(undefined1 (*) [32])((long)src_argb0 + 0x20),
                         *(undefined1 (*) [32])
                          (*(undefined1 (*) [32])((long)src_argb0 + 0x20) + src_stride_argb));
    auVar3 = vpavgb_avx2(*(undefined1 (*) [32])((long)src_argb0 + 0x40),
                         *(undefined1 (*) [32])
                          (*(undefined1 (*) [32])((long)src_argb0 + 0x40) + src_stride_argb));
    auVar4 = vpavgb_avx2(*(undefined1 (*) [32])((long)src_argb0 + 0x60),
                         *(undefined1 (*) [32])
                          (*(undefined1 (*) [32])((long)src_argb0 + 0x60) + src_stride_argb));
    src_argb0 = (uint8_t *)((long)src_argb0 + 0x80);
    auVar7 = vshufps_avx(auVar2,auVar8,0x88);
    auVar2 = vshufps_avx(auVar2,auVar8,0xdd);
    auVar8 = vpavgb_avx2(auVar2,auVar7);
    auVar7 = vshufps_avx(auVar3,auVar4,0x88);
    auVar2 = vshufps_avx(auVar3,auVar4,0xdd);
    auVar7 = vpavgb_avx2(auVar2,auVar7);
    auVar2 = vpmaddubsw_avx2(auVar8,auVar11);
    auVar3 = vpmaddubsw_avx2(auVar7,auVar11);
    auVar8 = vpmaddubsw_avx2(auVar8,auVar10);
    auVar4 = vpmaddubsw_avx2(auVar7,auVar10);
    auVar7 = vphaddw_avx2(auVar2,auVar3);
    auVar2 = vphaddw_avx2(auVar8,auVar4);
    auVar8 = vpsraw_avx2(auVar7,8);
    auVar7 = vpsraw_avx2(auVar2,8);
    auVar7 = vpacksswb_avx2(auVar8,auVar7);
    auVar7 = vpermq_avx2(auVar7,0xd8);
    auVar7 = vpshufb_avx2(auVar7,(undefined1  [32])libyuv::kShufARGBToUV_AVX);
    auVar7 = vpaddb_avx2(auVar7,auVar9);
    *(undefined1 (*) [16])dst_u = auVar7._0_16_;
    *(undefined1 (*) [16])((long)dst_u + lVar5) = auVar7._16_16_;
    dst_u = (uint8_t *)((long)dst_u + 0x10);
    iVar6 = width + -0x20;
    bVar1 = 0x1f < width;
    width = iVar6;
  } while (iVar6 != 0 && bVar1);
  return;
}

Assistant:

void ARGBToUVRow_AVX2(const uint8_t* src_argb0,
                      int src_stride_argb,
                      uint8_t* dst_u,
                      uint8_t* dst_v,
                      int width) {
  asm volatile(
      "vbroadcastf128 %5,%%ymm5                  \n"
      "vbroadcastf128 %6,%%ymm6                  \n"
      "vbroadcastf128 %7,%%ymm7                  \n"
      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "vmovdqu     0x40(%0),%%ymm2               \n"
      "vmovdqu     0x60(%0),%%ymm3               \n"
      "vpavgb      0x00(%0,%4,1),%%ymm0,%%ymm0   \n"
      "vpavgb      0x20(%0,%4,1),%%ymm1,%%ymm1   \n"
      "vpavgb      0x40(%0,%4,1),%%ymm2,%%ymm2   \n"
      "vpavgb      0x60(%0,%4,1),%%ymm3,%%ymm3   \n"
      "lea         0x80(%0),%0                   \n"
      "vshufps     $0x88,%%ymm1,%%ymm0,%%ymm4    \n"
      "vshufps     $0xdd,%%ymm1,%%ymm0,%%ymm0    \n"
      "vpavgb      %%ymm4,%%ymm0,%%ymm0          \n"
      "vshufps     $0x88,%%ymm3,%%ymm2,%%ymm4    \n"
      "vshufps     $0xdd,%%ymm3,%%ymm2,%%ymm2    \n"
      "vpavgb      %%ymm4,%%ymm2,%%ymm2          \n"

      "vpmaddubsw  %%ymm7,%%ymm0,%%ymm1          \n"
      "vpmaddubsw  %%ymm7,%%ymm2,%%ymm3          \n"
      "vpmaddubsw  %%ymm6,%%ymm0,%%ymm0          \n"
      "vpmaddubsw  %%ymm6,%%ymm2,%%ymm2          \n"
      "vphaddw     %%ymm3,%%ymm1,%%ymm1          \n"
      "vphaddw     %%ymm2,%%ymm0,%%ymm0          \n"
      "vpsraw      $0x8,%%ymm1,%%ymm1            \n"
      "vpsraw      $0x8,%%ymm0,%%ymm0            \n"
      "vpacksswb   %%ymm0,%%ymm1,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vpshufb     %8,%%ymm0,%%ymm0              \n"
      "vpaddb      %%ymm5,%%ymm0,%%ymm0          \n"

      "vextractf128 $0x0,%%ymm0,(%1)             \n"
      "vextractf128 $0x1,%%ymm0,0x0(%1,%2,1)     \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x20,%3                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_argb0),                   // %0
        "+r"(dst_u),                       // %1
        "+r"(dst_v),                       // %2
        "+rm"(width)                       // %3
      : "r"((intptr_t)(src_stride_argb)),  // %4
        "m"(kAddUV128),                    // %5
        "m"(kARGBToV),                     // %6
        "m"(kARGBToU),                     // %7
        "m"(kShufARGBToUV_AVX)             // %8
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}